

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uint-hash.c
# Opt level: O0

_Bool Curl_uint_hash_remove(uint_hash *h,uint id)

{
  uint_hash_entry **ppuVar1;
  uint_hash_entry *he_00;
  uint uVar2;
  uint_hash_entry *local_30;
  uint_hash_entry **he_anchor;
  uint_hash_entry *he;
  uint id_local;
  uint_hash *h_local;
  
  if (h->table == (uint_hash_entry **)0x0) {
LAB_0019a441:
    h_local._7_1_ = false;
  }
  else {
    ppuVar1 = h->table;
    uVar2 = uint_hash_hash(id,h->slots);
    he_00 = (uint_hash_entry *)(ppuVar1 + uVar2);
    do {
      local_30 = he_00;
      if (local_30->next == (uint_hash_entry *)0x0) goto LAB_0019a441;
      he_00 = local_30->next;
    } while (id != he_00->id);
    uint_hash_entry_unlink(h,&local_30->next,he_00);
    uint_hash_entry_destroy(h,he_00);
    h_local._7_1_ = true;
  }
  return h_local._7_1_;
}

Assistant:

bool Curl_uint_hash_remove(struct uint_hash *h, unsigned int id)
{
  DEBUGASSERT(h);
  DEBUGASSERT(h->slots);
  DEBUGASSERT(h->init == CURL_UINTHASHINIT);
  if(h->table) {
    struct uint_hash_entry *he, **he_anchor;

    he_anchor = CURL_UINT_HASH_SLOT_ADDR(h, id);
    while(*he_anchor) {
      he = *he_anchor;
      if(id == he->id) {
        uint_hash_entry_unlink(h, he_anchor, he);
        uint_hash_entry_destroy(h, he);
        return TRUE;
      }
      he_anchor = &he->next;
    }
  }
  return FALSE;
}